

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O1

void h265e_code_slice_header(H265eSlice *slice,MppWriteCtx *bitIf,RK_U32 slice_segment_addr)

{
  H265eSps *pHVar1;
  H265eReferencePictureSet *rps;
  RK_U32 RVar2;
  RK_S32 *pRVar3;
  int iVar4;
  int len;
  uint uVar5;
  uint uVar6;
  int iVar7;
  RK_U32 RVar8;
  long lVar9;
  ulong in_R10;
  ulong uVar10;
  RK_U32 RVar11;
  long lVar12;
  RK_S32 *pRVar13;
  bool bVar14;
  RK_S32 ltrpInSPS [16];
  int local_a0;
  RK_S32 aRStack_78 [18];
  
  pHVar1 = slice->m_sps;
  uVar6 = pHVar1->m_maxCUSize;
  RVar8 = pHVar1->m_picWidthInLumaSamples;
  RVar11 = pHVar1->m_picHeightInLumaSamples;
  mpp_writer_put_bits(bitIf,(uint)(slice_segment_addr == 0),1);
  mpp_writer_put_ue(bitIf,slice->m_ppsId);
  if (slice_segment_addr != 0) {
    iVar4 = -1;
    do {
      iVar4 = iVar4 + 1;
    } while ((uint)(1 << ((byte)iVar4 & 0x1f)) <
             (((uVar6 - 1) + RVar11) / uVar6) * ((RVar8 + (uVar6 - 1)) / uVar6));
    mpp_writer_put_bits(bitIf,slice_segment_addr,iVar4);
  }
  rps = slice->m_rps;
  slice->m_enableTMVPFlag = 0;
  if (slice->m_dependentSliceSegmentFlag != 0) goto LAB_001ce63c;
  if (slice->m_pps->m_numExtraSliceHeaderBits != 0) {
    uVar6 = 0;
    do {
      mpp_writer_put_bits(bitIf,(uint)((slice->slice_reserved_flag >> (uVar6 & 0x1f) & 1) != 0),1);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)slice->m_pps->m_numExtraSliceHeaderBits);
  }
  mpp_writer_put_ue(bitIf,slice->m_sliceType);
  if (slice->m_pps->m_outputFlagPresentFlag != 0) {
    mpp_writer_put_bits(bitIf,(uint)(slice->m_picOutputFlag != 0),1);
  }
  if (slice->m_sliceType != I_SLICE) {
    RVar8 = slice->m_sps->m_bitsForPOC;
    iVar4 = 1 << ((byte)RVar8 & 0x1f);
    mpp_writer_put_bits(bitIf,((slice->poc - slice->last_idr) + iVar4) % iVar4,RVar8);
    if (slice->m_bdIdx < 0) {
      mpp_writer_put_bits(bitIf,0,1);
      code_st_refpic_set(bitIf,rps,(slice->m_sps->m_RPSList).m_numberOfReferencePictureSets);
    }
    else {
      mpp_writer_put_bits(bitIf,1,1);
      iVar4 = -1;
      do {
        iVar4 = iVar4 + 1;
      } while (1 << ((byte)iVar4 & 0x1f) < (slice->m_sps->m_RPSList).m_numberOfReferencePictureSets)
      ;
      if (iVar4 != 0) {
        mpp_writer_put_bits(bitIf,slice->m_bdIdx,iVar4);
      }
    }
    pHVar1 = slice->m_sps;
    if (pHVar1->m_bLongTermRefsPresent != 0) {
      RVar8 = rps->num_long_term_pic;
      if ((int)RVar8 < 1) {
        iVar4 = 0;
        RVar11 = 0;
      }
      else {
        iVar7 = rps->m_numberOfPictures;
        lVar9 = (long)iVar7;
        RVar2 = pHVar1->m_bitsForPOC;
        uVar6 = pHVar1->m_numLongTermRefPicSPS;
        RVar11 = 0;
        iVar4 = 0;
        do {
          bVar14 = true;
          if ((ulong)uVar6 != 0) {
            uVar10 = 0;
            do {
              if (((int)rps->m_ref[lVar9 + 0xf] % (1 << ((byte)RVar2 & 0x1f)) ==
                   pHVar1->m_ltRefPicPocLsbSps[uVar10]) &&
                 (pHVar1->m_usedByCurrPicLtSPSFlag[uVar10] == rps->delta_poc[lVar9 + 0xf])) {
                bVar14 = false;
                in_R10 = uVar10 & 0xffffffff;
                break;
              }
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          if (bVar14) {
            iVar4 = iVar4 + 1;
          }
          else {
            aRStack_78[(int)RVar11] = (RK_S32)in_R10;
            RVar11 = RVar11 + 1;
          }
          lVar9 = lVar9 + -1;
        } while ((int)(iVar7 - RVar8) < lVar9);
      }
      iVar7 = -1;
      do {
        iVar7 = iVar7 + 1;
      } while ((uint)(1 << ((byte)iVar7 & 0x1f)) < pHVar1->m_numLongTermRefPicSPS);
      if (pHVar1->m_numLongTermRefPicSPS != 0) {
        mpp_writer_put_ue(bitIf,RVar11);
      }
      mpp_writer_put_ue(bitIf,RVar8);
      lVar9 = (long)rps->num_positive_pic + (long)rps->num_negative_pic;
      lVar12 = (long)rps->m_numberOfPictures;
      if ((int)lVar9 < rps->m_numberOfPictures) {
        pRVar13 = rps->delta_poc + lVar12 + 0xf;
        local_a0 = 0;
        do {
          if (iVar4 < (int)RVar11) {
            pRVar3 = aRStack_78 + iVar4;
            len = iVar7;
            if (iVar7 != 0) goto LAB_001ce986;
          }
          else {
            mpp_writer_put_bits(bitIf,pRVar13[-0x43],slice->m_sps->m_bitsForPOC);
            len = 1;
            pRVar3 = pRVar13;
LAB_001ce986:
            mpp_writer_put_bits(bitIf,*pRVar3,len);
          }
          mpp_writer_put_bits(bitIf,pRVar13[-0x23],1);
          if (pRVar13[-0x23] != 0) {
            if (((int)lVar12 == rps->m_numberOfPictures) ||
               ((int)lVar12 + -1 == rps->m_numberOfPictures + ~RVar11)) {
              RVar8 = pRVar13[-0x33];
            }
            else {
              RVar8 = pRVar13[-0x33] - local_a0;
            }
            mpp_writer_put_ue(bitIf,RVar8);
            local_a0 = pRVar13[-0x33];
          }
          lVar12 = lVar12 + -1;
          pRVar13 = pRVar13 + -1;
        } while (lVar9 < lVar12);
      }
    }
    if (slice->m_sps->m_TMVPFlagsPresent != 0) {
      mpp_writer_put_bits(bitIf,(uint)(slice->m_enableTMVPFlag != 0),1);
    }
  }
  if (slice->m_sps->m_bUseSAO != 0) {
    mpp_writer_put_bits(bitIf,0,1);
    mpp_writer_put_bits(bitIf,0,1);
  }
  if ((slice->m_sliceType != I_SLICE) &&
     (RVar8 = slice->m_numRefIdx[0], RVar11 = slice->m_pps->m_numRefIdxL0DefaultActive,
     mpp_writer_put_bits(bitIf,(uint)(RVar8 != RVar11),1), RVar8 != RVar11)) {
    mpp_writer_put_ue(bitIf,slice->m_numRefIdx[0] - 1);
    slice->m_numRefIdx[1] = 0;
  }
  if ((slice->m_pps->m_listsModificationPresentFlag != 0) &&
     (iVar4 = rps->num_positive_pic + rps->num_negative_pic, uVar6 = iVar4 + rps->num_long_term_pic,
     uVar6 != 0 && SCARRY4(iVar4,rps->num_long_term_pic) == (int)uVar6 < 0)) {
    uVar10 = 0;
    uVar5 = 0;
    do {
      uVar5 = (uVar5 + 1) - (uint)(rps->m_used[uVar10] == 0);
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
    if ((1 < uVar5) &&
       (mpp_writer_put_bits(bitIf,(uint)((slice->m_RefPicListModification).
                                         m_refPicListModificationFlagL0 != 0),1),
       (slice->m_RefPicListModification).m_refPicListModificationFlagL0 != 0)) {
      iVar4 = rps->num_positive_pic + rps->num_negative_pic;
      uVar6 = iVar4 + rps->num_long_term_pic;
      if (uVar6 == 0 || SCARRY4(iVar4,rps->num_long_term_pic) != (int)uVar6 < 0) {
        iVar4 = 0;
      }
      else {
        uVar10 = 0;
        iVar4 = 0;
        do {
          iVar4 = (iVar4 + 1) - (uint)(rps->m_used[uVar10] == 0);
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      if (1 < iVar4) {
        iVar7 = 1;
        if (iVar4 != 2) {
          uVar6 = iVar4 - 1;
          do {
            iVar7 = iVar7 + 1;
            bVar14 = 3 < uVar6;
            uVar6 = uVar6 >> 1;
          } while (bVar14);
        }
        if (slice->m_numRefIdx[0] != 0) {
          uVar10 = 0;
          do {
            mpp_writer_put_bits(bitIf,(slice->m_RefPicListModification).m_RefPicSetIdxL0[uVar10],
                                iVar7);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (uint)slice->m_numRefIdx[0]);
        }
      }
    }
  }
  if (slice->m_pps->m_cabacInitPresentFlag != 0) {
    mpp_writer_put_bits(bitIf,slice->m_cabacInitFlag,1);
  }
  if ((slice->m_enableTMVPFlag != 0) && (slice->m_sliceType != I_SLICE)) {
    if (slice->m_colFromL0Flag == 0) {
      iVar4 = slice->m_numRefIdx[1];
    }
    else {
      if (slice->m_colFromL0Flag != 1) goto LAB_001cec15;
      iVar4 = slice->m_numRefIdx[0];
    }
    if (1 < iVar4) {
      mpp_writer_put_ue(bitIf,slice->m_colRefIdx);
    }
  }
LAB_001cec15:
  if (slice->m_sliceType != I_SLICE) {
    RVar8 = 4;
    if (slice->m_maxNumMergeCand != 0) {
      RVar8 = 5 - slice->m_maxNumMergeCand;
    }
    mpp_writer_put_ue(bitIf,RVar8);
  }
  mpp_writer_put_se(bitIf,(slice->m_sliceQp - slice->m_pps->m_picInitQPMinus26) + -0x1a);
  if (slice->m_pps->m_bSliceChromaQpFlag != 0) {
    mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCb);
    mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCr);
  }
  if (slice->m_pps->m_deblockingFilterControlPresentFlag != 0) {
    if (slice->m_pps->m_deblockingFilterOverrideEnabledFlag != 0) {
      mpp_writer_put_bits(bitIf,slice->m_deblockingFilterOverrideFlag,1);
    }
    if ((slice->m_deblockingFilterOverrideFlag != 0) &&
       (mpp_writer_put_bits(bitIf,slice->m_deblockingFilterDisable,1),
       slice->m_deblockingFilterDisable == 0)) {
      mpp_writer_put_se(bitIf,slice->m_deblockingFilterBetaOffsetDiv2);
      mpp_writer_put_se(bitIf,slice->m_deblockingFilterTcOffsetDiv2);
    }
  }
LAB_001ce63c:
  if (slice->m_pps->m_tiles_enabled_flag != 0) {
    mpp_writer_put_ue(bitIf,0);
  }
  if ((slice->m_pps->m_sliceHeaderExtensionPresentFlag != 0) &&
     (mpp_writer_put_ue(bitIf,slice->slice_header_extension_length),
     slice->slice_header_extension_length != 0)) {
    uVar6 = 0;
    do {
      mpp_writer_put_bits(bitIf,0,8);
      uVar6 = uVar6 + 1;
    } while (uVar6 < slice->slice_header_extension_length);
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","leave\n","h265e_code_slice_header");
    return;
  }
  return;
}

Assistant:

void h265e_code_slice_header(H265eSlice *slice, MppWriteCtx *bitIf,
                             RK_U32 slice_segment_addr)
{
    RK_U32 i = 0;
    RK_U32 slice_address_addr_bits = 0;
    H265eSps *sps = slice->m_sps;
    RK_U32 pic_width_in_ctb = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) /
                              sps->m_maxCUSize;
    RK_U32 pic_height_in_ctb = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) /
                               sps->m_maxCUSize;
    RK_U32 max_ctu_num = pic_width_in_ctb * pic_height_in_ctb;

    mpp_writer_put_bits(bitIf, (slice_segment_addr == 0), 1); //first_slice_segment_in_pic_flag
    mpp_writer_put_ue(bitIf, slice->m_ppsId);

    if (slice_segment_addr != 0) {
        while (max_ctu_num > (RK_U32)(1 << slice_address_addr_bits)) {
            slice_address_addr_bits++;
        }
        //slice_segment_address
        mpp_writer_put_bits(bitIf, slice_segment_addr, slice_address_addr_bits);
    }

    H265eReferencePictureSet* rps = slice->m_rps;
    slice->m_enableTMVPFlag = 0;
    if (!slice->m_dependentSliceSegmentFlag) {
        for (i = 0; i < (RK_U32)slice->m_pps->m_numExtraSliceHeaderBits; i++) {
            mpp_writer_put_bits(bitIf, (slice->slice_reserved_flag >> i) & 0x1, 1);
        }

        mpp_writer_put_ue(bitIf, slice->m_sliceType);

        if (slice->m_pps->m_outputFlagPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_picOutputFlag ? 1 : 0, 1);
        }

        if (slice->m_sliceType != I_SLICE) { // skip frame can't iDR
            RK_S32 picOrderCntLSB = (slice->poc - slice->last_idr + (1 << slice->m_sps->m_bitsForPOC)) % (1 << slice->m_sps->m_bitsForPOC);
            mpp_writer_put_bits(bitIf, picOrderCntLSB, slice->m_sps->m_bitsForPOC);
            if (slice->m_bdIdx < 0) {
                mpp_writer_put_bits(bitIf, 0, 1);
                code_st_refpic_set(bitIf, rps, slice->m_sps->m_RPSList.m_numberOfReferencePictureSets);
            } else {
                mpp_writer_put_bits(bitIf, 1, 1);
                RK_S32 numBits = 0;
                while ((1 << numBits) < slice->m_sps->m_RPSList.m_numberOfReferencePictureSets) {
                    numBits++;
                }

                if (numBits > 0) {
                    mpp_writer_put_bits(bitIf, slice->m_bdIdx, numBits);
                }
            }
            if (slice->m_sps->m_bLongTermRefsPresent) {

                RK_S32 numLtrpInSH = rps->m_numberOfPictures;
                RK_S32 ltrpInSPS[MAX_REFS];
                RK_S32 numLtrpInSPS = 0;
                RK_U32 ltrpIndex;
                RK_S32 counter = 0;
                RK_S32 k;
                for (k = rps->m_numberOfPictures - 1; k > rps->m_numberOfPictures - rps->num_long_term_pic - 1; k--) {
                    if (find_matching_ltrp(slice, &ltrpIndex, rps->poc[k], rps->m_used[k])) {
                        ltrpInSPS[numLtrpInSPS] = ltrpIndex;
                        numLtrpInSPS++;
                    } else {
                        counter++;
                    }
                }

                numLtrpInSH -= rps->m_numberOfPictures - rps->num_long_term_pic;

                RK_S32 bitsForLtrpInSPS = 0;
                while (slice->m_sps->m_numLongTermRefPicSPS > (RK_U32)(1 << bitsForLtrpInSPS)) {
                    bitsForLtrpInSPS++;
                }

                if (slice->m_sps->m_numLongTermRefPicSPS > 0) {
                    mpp_writer_put_ue(bitIf, numLtrpInSPS);
                }
                mpp_writer_put_ue(bitIf, numLtrpInSH);
                // Note that the LSBs of the LT ref. pic. POCs must be sorted before.
                // Not sorted here because LT ref indices will be used in setRefPicList()
                RK_S32 prevDeltaMSB = 0;
                RK_S32 offset = rps->num_negative_pic + rps->num_positive_pic;
                for ( k = rps->m_numberOfPictures - 1; k > offset - 1; k--) {
                    if (counter < numLtrpInSPS) {
                        if (bitsForLtrpInSPS > 0) {
                            mpp_writer_put_bits(bitIf, ltrpInSPS[counter], bitsForLtrpInSPS);
                        }
                    } else {
                        mpp_writer_put_bits(bitIf, rps->m_pocLSBLT[k], slice->m_sps->m_bitsForPOC);
                        mpp_writer_put_bits(bitIf, rps->m_used[k], 1);
                    }
                    mpp_writer_put_bits(bitIf, rps->m_deltaPocMSBPresentFlag[k], 1);

                    if (rps->m_deltaPocMSBPresentFlag[k]) {
                        RK_U32 deltaFlag = 0;
                        if ((k == rps->m_numberOfPictures - 1) || (k == rps->m_numberOfPictures - 1 - numLtrpInSPS)) {
                            deltaFlag = 1;
                        }
                        if (deltaFlag) {
                            mpp_writer_put_ue(bitIf, rps->m_deltaPOCMSBCycleLT[k]);
                        } else {
                            RK_S32 differenceInDeltaMSB = rps->m_deltaPOCMSBCycleLT[k] - prevDeltaMSB;
                            mpp_writer_put_ue(bitIf, differenceInDeltaMSB);
                        }
                        prevDeltaMSB = rps->m_deltaPOCMSBCycleLT[k];
                    }
                }
            }
            if (slice->m_sps->m_TMVPFlagsPresent) {
                mpp_writer_put_bits(bitIf, slice->m_enableTMVPFlag ? 1 : 0, 1);
            }
        }

        if (slice->m_sps->m_bUseSAO) { //skip frame close sao
            mpp_writer_put_bits(bitIf, 0, 1);
            mpp_writer_put_bits(bitIf, 0, 1);

        }
        //check if numrefidxes match the defaults. If not, override

        if (slice->m_sliceType != I_SLICE) {
            RK_U32 overrideFlag = (slice->m_numRefIdx[0] != (RK_S32)slice->m_pps->m_numRefIdxL0DefaultActive);
            mpp_writer_put_bits(bitIf, overrideFlag ? 1 : 0, 1);
            if (overrideFlag) {
                mpp_writer_put_ue(bitIf, slice->m_numRefIdx[0] - 1);
                slice->m_numRefIdx[1] = 0;
            }
        }

        if (slice->m_pps->m_listsModificationPresentFlag && get_num_rps_cur_templist(rps) > 1) {
            H265eRefPicListModification* refPicListModification = &slice->m_RefPicListModification;
            mpp_writer_put_bits(bitIf, refPicListModification->m_refPicListModificationFlagL0 ? 1 : 0, 1);
            if (refPicListModification->m_refPicListModificationFlagL0) {
                RK_S32 numRpsCurrTempList0 = get_num_rps_cur_templist(rps);
                if (numRpsCurrTempList0 > 1) {
                    RK_S32 length = 1;
                    numRpsCurrTempList0--;
                    while (numRpsCurrTempList0 >>= 1) {
                        length++;
                    }
                    for (i = 0; i < (RK_U32)slice->m_numRefIdx[0]; i++) {
                        mpp_writer_put_bits(bitIf, refPicListModification->m_RefPicSetIdxL0[i], length);
                    }
                }
            }
        }

        if (slice->m_pps->m_cabacInitPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_cabacInitFlag, 1);
        }

        if (slice->m_enableTMVPFlag) {

            if (slice->m_sliceType != I_SLICE &&
                ((slice->m_colFromL0Flag == 1 && slice->m_numRefIdx[0] > 1) ||
                 (slice->m_colFromL0Flag == 0 && slice->m_numRefIdx[1] > 1))) {
                mpp_writer_put_ue(bitIf, slice->m_colRefIdx);
            }
        }

        if (slice->m_sliceType != I_SLICE) {
            RK_S32 flag = MRG_MAX_NUM_CANDS - slice->m_maxNumMergeCand;
            flag = flag == 5 ? 4 : flag;
            mpp_writer_put_ue(bitIf, flag);
        }
        RK_S32 code = slice->m_sliceQp - (slice->m_pps->m_picInitQPMinus26 + 26);
        mpp_writer_put_se(bitIf, code);
        if (slice->m_pps->m_bSliceChromaQpFlag) {
            code = slice->m_sliceQpDeltaCb;
            mpp_writer_put_se(bitIf, code);
            code = slice->m_sliceQpDeltaCr;
            mpp_writer_put_se(bitIf, code);
        }
        if (slice->m_pps->m_deblockingFilterControlPresentFlag) {
            if (slice->m_pps->m_deblockingFilterOverrideEnabledFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterOverrideFlag, 1);
            }
            if (slice->m_deblockingFilterOverrideFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterDisable, 1);
                if (!slice->m_deblockingFilterDisable) {
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterBetaOffsetDiv2);
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterTcOffsetDiv2);
                }
            }
        }
    }
    if (slice->m_pps->m_tiles_enabled_flag) {
        mpp_writer_put_ue(bitIf, 0);    // num_entry_point_offsets
    }
    if (slice->m_pps->m_sliceHeaderExtensionPresentFlag) {
        mpp_writer_put_ue(bitIf, slice->slice_header_extension_length);
        for (i = 0; i < slice->slice_header_extension_length; i++) {
            mpp_writer_put_bits(bitIf, 0, 8);
        }
    }
    h265e_dbg_func("leave\n");
}